

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O1

UINT8 __thiscall GYMPlayer::SeekToTick(GYMPlayer *this,UINT32 tick)

{
  UINT32 UVar1;
  
  this->_playState = this->_playState | 8;
  UVar1 = tick - this->_playTick;
  if (this->_playTick <= tick && UVar1 != 0) {
    ParseFile(this,UVar1);
  }
  UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_playTick);
  this->_playSmpl = UVar1;
  this->_playState = this->_playState & 0xf7;
  return '\0';
}

Assistant:

UINT8 GYMPlayer::SeekToTick(UINT32 tick)
{
	_playState |= PLAYSTATE_SEEK;
	if (tick > _playTick)
		ParseFile(tick - _playTick);
	_playSmpl = Tick2Sample(_playTick);
	_playState &= ~PLAYSTATE_SEEK;
	return 0x00;
}